

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

Image * __thiscall Image::nearestNeighbourInterpolation(Image *__return_storage_ptr__,Image *this)

{
  int **ppiVar1;
  int **ppiVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  
  Image(__return_storage_ptr__,this->row * 2,this->col * 2,this->maxGray);
  ppiVar1 = __return_storage_ptr__->matrix;
  for (uVar3 = 0; SBORROW8(uVar3,(long)this->row * 2) != (long)(uVar3 + (long)this->row * -2) < 0;
      uVar3 = uVar3 + 1) {
    ppiVar2 = this->matrix;
    for (uVar4 = 0; SBORROW8(uVar4,(long)this->col * 2) != (long)(uVar4 + (long)this->col * -2) < 0;
        uVar4 = uVar4 + 1) {
      ppiVar1[uVar3][uVar4] = ppiVar2[uVar3 >> 1 & 0x7fffffff][uVar4 >> 1 & 0x7fffffff];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::nearestNeighbourInterpolation()
{
    Image result = Image(2*row, 2*col, maxGray);

    for (int i = 0; i < 2*row; ++i) {
        for (int j = 0; j < 2*col; ++j) {
            result[i][j] = matrix[i/2][j/2];
        }
    }

    return result;
}